

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O0

binary_operator_t tchecker::reverse_cmp(binary_operator_t op)

{
  invalid_argument *this;
  binary_operator_t local_c;
  binary_operator_t op_local;
  
  switch(op) {
  case EXPR_OP_LT:
    local_c = EXPR_OP_GT;
    break;
  case EXPR_OP_LE:
    local_c = EXPR_OP_GE;
    break;
  case EXPR_OP_EQ:
    local_c = EXPR_OP_EQ;
    break;
  case EXPR_OP_NEQ:
    local_c = EXPR_OP_NEQ;
    break;
  case EXPR_OP_GE:
    local_c = EXPR_OP_LE;
    break;
  case EXPR_OP_GT:
    local_c = EXPR_OP_LT;
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Cannot reverse non-comparison binary operator");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return local_c;
}

Assistant:

enum tchecker::binary_operator_t reverse_cmp(enum tchecker::binary_operator_t op)
{
  switch (op) {
  case tchecker::EXPR_OP_EQ:
    return tchecker::EXPR_OP_EQ;
  case tchecker::EXPR_OP_GE:
    return tchecker::EXPR_OP_LE;
  case tchecker::EXPR_OP_GT:
    return tchecker::EXPR_OP_LT;
  case tchecker::EXPR_OP_LE:
    return tchecker::EXPR_OP_GE;
  case tchecker::EXPR_OP_LT:
    return tchecker::EXPR_OP_GT;
  case tchecker::EXPR_OP_NEQ:
    return tchecker::EXPR_OP_NEQ;
  default:
    throw std::invalid_argument("Cannot reverse non-comparison binary operator");
  }
}